

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

int Cnf_CutCountClauses(Aig_Man_t *p,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int nSize;
  int RetValue;
  int i;
  Aig_Obj_t *pObj;
  word Truth;
  Vec_Int_t *vCover_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Man_t *p_local;
  
  Truth = (word)vCover;
  vCover_local = (Vec_Int_t *)vNodes;
  vNodes_local = vLeaves;
  vLeaves_local = (Vec_Ptr_t *)p;
  iVar1 = Vec_PtrSize(vLeaves);
  if (iVar1 < 7) {
    pObj = (Aig_Obj_t *)
           Cnf_CutDeriveTruth((Aig_Man_t *)vLeaves_local,vNodes_local,(Vec_Ptr_t *)vCover_local);
    iVar1 = Vec_PtrSize(vNodes_local);
    iVar1 = Kit_TruthIsop((uint *)&pObj,iVar1,(Vec_Int_t *)Truth,0);
    if (iVar1 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x1da,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)Truth);
    pObj = (Aig_Obj_t *)((ulong)pObj ^ 0xffffffffffffffff);
    iVar2 = Vec_PtrSize(vNodes_local);
    iVar2 = Kit_TruthIsop((uint *)&pObj,iVar2,(Vec_Int_t *)Truth,0);
    if (iVar2 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x1e0,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)Truth);
    p_local._4_4_ = iVar2 + iVar1;
  }
  else {
    for (nSize = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vCover_local), nSize < iVar1; nSize = nSize + 1
        ) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vCover_local,nSize);
      iVar1 = Aig_ObjFaninC0(pAVar3);
      if ((iVar1 != 0) &&
         (pAVar4 = Aig_ObjFanin0(pAVar3), (*(ulong *)&pAVar4->field_0x18 >> 4 & 1) == 0)) {
        printf("Unusual 1!\n");
      }
      iVar1 = Aig_ObjFaninC1(pAVar3);
      if ((iVar1 != 0) &&
         (pAVar3 = Aig_ObjFanin1(pAVar3), (*(ulong *)&pAVar3->field_0x18 >> 4 & 1) == 0)) {
        printf("Unusual 2!\n");
      }
    }
    iVar1 = Vec_PtrSize(vNodes_local);
    p_local._4_4_ = iVar1 + 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cnf_CutCountClauses( Aig_Man_t * p, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vCover )
{
    word Truth;
    Aig_Obj_t * pObj;
    int i, RetValue, nSize = 0;
    if ( Vec_PtrSize(vLeaves) > 6 )
    {
        // make sure this is an AND gate
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkA )
                printf( "Unusual 1!\n" );
            if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkA )
                printf( "Unusual 2!\n" );
            continue;

            assert( !Aig_ObjFaninC0(pObj) || Aig_ObjFanin0(pObj)->fMarkA );
            assert( !Aig_ObjFaninC1(pObj) || Aig_ObjFanin1(pObj)->fMarkA );
        }
        return Vec_PtrSize(vLeaves) + 1;
    }
    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);
    return nSize;
}